

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objnam.c
# Opt level: O3

boolean wishymatch(char *u_str,char *o_str,boolean retry_inverted)

{
  char cVar1;
  boolean bVar2;
  int iVar3;
  char *pcVar4;
  char *pcVar5;
  size_t sVar6;
  char *pcVar7;
  char buf [256];
  char acStack_128 [256];
  
  pcVar7 = acStack_128;
  if ((flags.debug != '\0') && (iVar3 = strcmp(o_str,"beartrap"), iVar3 == 0)) {
    iVar3 = strncasecmp(o_str,u_str,8);
    return iVar3 == 0;
  }
  bVar2 = fuzzymatch(u_str,o_str," -",'\x01');
  if (bVar2 != '\0') {
    return '\x01';
  }
  if (retry_inverted == '\0') {
LAB_00208e64:
    iVar3 = strncmp(o_str,"dwarvish ",9);
    if (iVar3 == 0) {
      iVar3 = strncasecmp(u_str,"dwarven ",8);
      if (iVar3 != 0) {
        return '\0';
      }
      pcVar4 = u_str + 8;
      pcVar7 = o_str + 9;
    }
    else {
      iVar3 = strncmp(o_str,"elven ",6);
      if (iVar3 == 0) {
        iVar3 = strncasecmp(u_str,"elvish ",7);
        if (iVar3 == 0) {
          pcVar4 = u_str + 7;
        }
        else {
          iVar3 = strncasecmp(u_str,"elfin ",6);
          if (iVar3 != 0) {
            return '\0';
          }
          pcVar4 = u_str + 6;
        }
        pcVar7 = o_str + 6;
      }
      else {
        iVar3 = strcmp(o_str,"aluminum");
        if (iVar3 != 0) {
          return '\0';
        }
        iVar3 = strncasecmp(u_str,"aluminium",0xffffffffffffffff);
        if (iVar3 != 0) {
          return '\0';
        }
        pcVar4 = u_str + 9;
        pcVar7 = o_str + 8;
      }
    }
    bVar2 = fuzzymatch(pcVar4,pcVar7," -",'\x01');
    return bVar2;
  }
  pcVar4 = strstri(u_str," of ");
  pcVar5 = strstri(o_str," of ");
  if (pcVar5 == (char *)0x0 && pcVar4 != (char *)0x0) {
    strcpy(acStack_128,pcVar4 + 4);
    sVar6 = strlen(acStack_128);
    (acStack_128 + sVar6)[0] = ' ';
    (acStack_128 + sVar6)[1] = '\0';
    pcVar5 = eos(acStack_128);
    if (u_str < pcVar4) {
      do {
        cVar1 = *u_str;
        u_str = u_str + 1;
        *pcVar5 = cVar1;
        pcVar5 = pcVar5 + 1;
      } while (u_str != pcVar4);
    }
    *pcVar5 = '\0';
  }
  else {
    if (pcVar4 != (char *)0x0 || pcVar5 == (char *)0x0) goto LAB_00208e64;
    strcpy(acStack_128,pcVar5 + 4);
    sVar6 = strlen(acStack_128);
    (acStack_128 + sVar6)[0] = ' ';
    (acStack_128 + sVar6)[1] = '\0';
    pcVar7 = eos(acStack_128);
    if (o_str < pcVar5) {
      do {
        cVar1 = *o_str;
        o_str = o_str + 1;
        *pcVar7 = cVar1;
        pcVar7 = pcVar7 + 1;
      } while (o_str != pcVar5);
    }
    *pcVar7 = '\0';
    o_str = acStack_128;
    pcVar7 = u_str;
  }
  bVar2 = fuzzymatch(pcVar7,o_str," -",'\x01');
  return bVar2;
}

Assistant:

static boolean wishymatch(const char *u_str,	/* from user, so might be variant spelling */
			  const char *o_str,	/* from objects[], so is in canonical form */
			  boolean retry_inverted)	/* optional extra "of" handling */
{
	/* special case: wizards can wish for traps.  The object is "beartrap"
	 * and the trap is "bear trap", so to let wizards wish for both we
	 * must not fuzzymatch.
	 */
	if (wizard && !strcmp(o_str, "beartrap"))
	    return !strncmpi(o_str, u_str, 8);

	/* ignore spaces & hyphens and upper/lower case when comparing */
	if (fuzzymatch(u_str, o_str, " -", TRUE)) return TRUE;

	if (retry_inverted) {
	    const char *u_of, *o_of;
	    char *p, buf[BUFSZ];

	    /* when just one of the strings is in the form "foo of bar",
	       convert it into "bar foo" and perform another comparison */
	    u_of = strstri(u_str, " of ");
	    o_of = strstri(o_str, " of ");
	    if (u_of && !o_of) {
		strcpy(buf, u_of + 4);
		p = eos(strcat(buf, " "));
		while (u_str < u_of) *p++ = *u_str++;
		*p = '\0';
		return fuzzymatch(buf, o_str, " -", TRUE);
	    } else if (o_of && !u_of) {
		strcpy(buf, o_of + 4);
		p = eos(strcat(buf, " "));
		while (o_str < o_of) *p++ = *o_str++;
		*p = '\0';
		return fuzzymatch(u_str, buf, " -", TRUE);
	    }
	}

	/* [note: if something like "elven speed boots" ever gets added, these
	   special cases should be changed to call wishymatch() recursively in
	   order to get the "of" inversion handling] */
	if (!strncmp(o_str, "dwarvish ", 9)) {
	    if (!strncmpi(u_str, "dwarven ", 8))
		return fuzzymatch(u_str + 8, o_str + 9, " -", TRUE);
	} else if (!strncmp(o_str, "elven ", 6)) {
	    if (!strncmpi(u_str, "elvish ", 7))
		return fuzzymatch(u_str + 7, o_str + 6, " -", TRUE);
	    else if (!strncmpi(u_str, "elfin ", 6))
		return fuzzymatch(u_str + 6, o_str + 6, " -", TRUE);
	} else if (!strcmp(o_str, "aluminum")) {
		/* this special case doesn't really fit anywhere else... */
		/* (note that " wand" will have been stripped off by now) */
	    if (!strcmpi(u_str, "aluminium"))
		return fuzzymatch(u_str + 9, o_str + 8, " -", TRUE);
	}

	return FALSE;
}